

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int check_token(Context_conflict2 *ctx,char *str)

{
  int iVar1;
  size_t __n;
  size_t len;
  char *str_local;
  Context_conflict2 *ctx_local;
  
  __n = strlen(str);
  if ((ctx->tokenlen == __n) && (iVar1 = strncasecmp(ctx->token,str,__n), iVar1 == 0)) {
    ctx->token = ctx->token + __n;
    ctx->tokenlen = 0;
    return 1;
  }
  return 0;
}

Assistant:

static int check_token(Context *ctx, const char *str)
{
    const size_t len = strlen(str);
    if ( (ctx->tokenlen != len) || (strncasecmp(ctx->token, str, len) != 0) )
        return 0;
    ctx->token += len;
    ctx->tokenlen = 0;
    return 1;
}